

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

int Gia_ManCoSuppSizeMax(Gia_Man_t *p,Vec_Wec_t *vSupps)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *p_00;
  bool bVar3;
  int local_30;
  int local_2c;
  int nSuppMax;
  int i;
  Vec_Int_t *vSuppOne;
  Gia_Obj_t *pObj;
  Vec_Wec_t *vSupps_local;
  Gia_Man_t *p_local;
  
  local_30 = 1;
  local_2c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar3 = false;
    if (local_2c < iVar1) {
      pGVar2 = Gia_ManCo(p,local_2c);
      bVar3 = pGVar2 != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    p_00 = Vec_WecEntry(vSupps,local_2c);
    iVar1 = Vec_IntSize(p_00);
    local_30 = Abc_MaxInt(local_30,iVar1);
    local_2c = local_2c + 1;
  }
  return local_30;
}

Assistant:

int Gia_ManCoSuppSizeMax( Gia_Man_t * p, Vec_Wec_t * vSupps )
{
    Gia_Obj_t * pObj; 
    Vec_Int_t * vSuppOne;
    int i, nSuppMax = 1;
    Gia_ManForEachCo( p, pObj, i )
    {
        vSuppOne = Vec_WecEntry( vSupps, i );
        nSuppMax = Abc_MaxInt( nSuppMax, Vec_IntSize(vSuppOne) );
    }
    return nSuppMax;
}